

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropTargetCustom(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar2 = GImGui;
  if ((GImGui->DragDropActive & 1U) == 0) {
    bb_local._7_1_ = false;
  }
  else {
    pIVar1 = GImGui->CurrentWindow;
    if ((GImGui->HoveredWindow == (ImGuiWindow *)0x0) ||
       (pIVar1->RootWindow != GImGui->HoveredWindow->RootWindow)) {
      bb_local._7_1_ = false;
    }
    else {
      if (id == 0) {
        __assert_fail("id != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                      ,0x22a2,"bool ImGui::BeginDragDropTargetCustom(const ImRect &, ImGuiID)");
      }
      bVar3 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
      if ((bVar3) && (id != (pIVar2->DragDropPayload).SourceId)) {
        if ((pIVar1->SkipItems & 1U) == 0) {
          if ((pIVar2->DragDropWithinSourceOrTarget & 1U) != 0) {
            __assert_fail("g.DragDropWithinSourceOrTarget == false",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                          ,0x22a8,"bool ImGui::BeginDragDropTargetCustom(const ImRect &, ImGuiID)");
          }
          (pIVar2->DragDropTargetRect).Min = bb->Min;
          (pIVar2->DragDropTargetRect).Max = bb->Max;
          pIVar2->DragDropTargetId = id;
          pIVar2->DragDropWithinSourceOrTarget = true;
          bb_local._7_1_ = true;
        }
        else {
          bb_local._7_1_ = false;
        }
      }
      else {
        bb_local._7_1_ = false;
      }
    }
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::BeginDragDropTargetCustom(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow == NULL || window->RootWindow != g.HoveredWindow->RootWindow)
        return false;
    IM_ASSERT(id != 0);
    if (!IsMouseHoveringRect(bb.Min, bb.Max) || (id == g.DragDropPayload.SourceId))
        return false;
    if (window->SkipItems)
        return false;

    IM_ASSERT(g.DragDropWithinSourceOrTarget == false);
    g.DragDropTargetRect = bb;
    g.DragDropTargetId = id;
    g.DragDropWithinSourceOrTarget = true;
    return true;
}